

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void flatbuffers::tests::ParseProtoTest(string *tests_data_path)

{
  bool bVar1;
  string proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> proto_path;
  string import_proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&proto_path,tests_data_path,"prototest/");
  proto_file._M_dataplus._M_p = (pointer)&proto_file.field_2;
  proto_file._M_string_length = 0;
  proto_file.field_2._M_local_buf[0] = '\0';
  std::operator+(&import_proto_file,tests_data_path,"prototest/test.proto");
  bVar1 = LoadFile(import_proto_file._M_dataplus._M_p,false,&proto_file);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"prototest/test.proto\").c_str(), false, &proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x123,"");
  std::__cxx11::string::~string((string *)&import_proto_file);
  import_proto_file._M_dataplus._M_p = (pointer)&import_proto_file.field_2;
  import_proto_file._M_string_length = 0;
  import_proto_file.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_28,tests_data_path,"prototest/imported.proto");
  bVar1 = LoadFile(local_28._M_dataplus._M_p,false,&import_proto_file);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"prototest/imported.proto\").c_str(), false, &import_proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x129,"");
  std::__cxx11::string::~string((string *)&local_28);
  proto_test(&proto_path,&proto_file);
  proto_test_union(&proto_path,&proto_file);
  proto_test_union_suffix(&proto_path,&proto_file);
  proto_test_include(&proto_path,&proto_file,&import_proto_file);
  proto_test_include_union(&proto_path,&proto_file,&import_proto_file);
  proto_test_id(&proto_path,&proto_file);
  proto_test_union_id(&proto_path,&proto_file);
  proto_test_union_suffix_id(&proto_path,&proto_file);
  proto_test_include_id(&proto_path,&proto_file,&import_proto_file);
  proto_test_include_union_id(&proto_path,&proto_file,&import_proto_file);
  ParseCorruptedProto(&proto_path);
  std::__cxx11::string::~string((string *)&import_proto_file);
  std::__cxx11::string::~string((string *)&proto_file);
  std::__cxx11::string::~string((string *)&proto_path);
  return;
}

Assistant:

void ParseProtoTest(const std::string &tests_data_path) {
  auto proto_path = tests_data_path + "prototest/";
  std::string proto_file;
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "prototest/test.proto").c_str(),
                            false, &proto_file),
      true);

  std::string import_proto_file;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "prototest/imported.proto").c_str(), false,
              &import_proto_file),
          true);

  proto_test(proto_path, proto_file);
  proto_test_union(proto_path, proto_file);
  proto_test_union_suffix(proto_path, proto_file);
  proto_test_include(proto_path, proto_file, import_proto_file);
  proto_test_include_union(proto_path, proto_file, import_proto_file);

  proto_test_id(proto_path, proto_file);
  proto_test_union_id(proto_path, proto_file);
  proto_test_union_suffix_id(proto_path, proto_file);
  proto_test_include_id(proto_path, proto_file, import_proto_file);
  proto_test_include_union_id(proto_path, proto_file, import_proto_file);

  ParseCorruptedProto(proto_path);
}